

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,RangeSelectExpression *param_1)

{
  NotSupportedException *this_00;
  allocator<char> local_39;
  string local_38;
  RangeSelectExpression *local_18;
  RangeSelectExpression *param_1_local;
  ExpressionPrinter *this_local;
  
  local_18 = param_1;
  param_1_local = (RangeSelectExpression *)this;
  this_00 = (NotSupportedException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RangeSelectExpression not supported for hgdb expression",&local_39
            );
  NotSupportedException::NotSupportedException(this_00,&local_38,*this->loc_);
  __cxa_throw(this_00,&NotSupportedException::typeinfo,NotSupportedException::~NotSupportedException
             );
}

Assistant:

void handle(const slang::ast::RangeSelectExpression &) {
        throw NotSupportedException("RangeSelectExpression not supported for hgdb expression",
                                    loc_);
    }